

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O0

int __thiscall DTSStreamReader::decodeHdInfo(DTSStreamReader *this,uint8_t *buff,uint8_t *end)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  uchar uVar6;
  byte bVar7;
  unsigned_short uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  long lVar12;
  BitStreamException *e;
  int nuNumBits4SAMask;
  uint16_t nuSpkrActivityMask;
  uchar nuMaxSampleRate;
  int nuBitResolution;
  int j_1;
  int nuInfoTextByteSize;
  int i_4;
  int i_3;
  int i_2;
  int nuNumMixOutConfigs;
  int nuBits4MixOutMask;
  int j;
  int i_1;
  int i;
  int nuNumAudioPresent;
  int nuExSSFrameDurationCode;
  bool bStaticFieldsPresent;
  uint8_t nuNumAssets;
  uint32_t *hdAudioData;
  bool isBlownUpHeader;
  int iStack_58;
  uchar nuSubStreamIndex;
  int hdFrameSize;
  int headerSize;
  undefined1 local_48 [8];
  BitStreamReader reader;
  uint8_t *end_local;
  uint8_t *buff_local;
  DTSStreamReader *this_local;
  
  reader._24_8_ = end;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_48);
  BitStreamReader::setBuffer((BitStreamReader *)local_48,buff + 5,(uint8_t *)reader._24_8_);
  bVar1 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,2);
  bVar2 = BitStreamReader::getBit((BitStreamReader *)local_48);
  if (bVar2) {
    uVar8 = BitStreamReader::getBits<unsigned_short>((BitStreamReader *)local_48,0xc);
    uVar9 = (uint)uVar8;
    uVar10 = BitStreamReader::getBits<int>((BitStreamReader *)local_48,0x14);
  }
  else {
    bVar4 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,8);
    uVar9 = (uint)bVar4;
    uVar8 = BitStreamReader::getBits<unsigned_short>((BitStreamReader *)local_48,0x10);
    uVar10 = (uint)uVar8;
  }
  iStack_58 = uVar9 + 1;
  hdAudioData._4_4_ = uVar10 + 1;
  if (this->m_hdType == DTS_SUBTYPE_UNINITIALIZED) {
    if ((ulong)reader._24_8_ < buff + (long)iStack_58 + 4) {
      this_local._4_4_ = -10;
    }
    else {
      uVar11 = my_ntohl(*(uint32_t *)(buff + iStack_58));
      if (uVar11 == 0xa801921) {
        this->m_hdType = DTS_SUBTYPE_EXPRESS;
      }
      else if (uVar11 == 0x1d95f262) {
        this->m_hdType = DTS_SUBTYPE_96;
      }
      else if (uVar11 == 0x41a29547) {
        this->m_hdType = DTS_SUBTYPE_MASTER_AUDIO;
      }
      else if ((uVar11 == 0x47004a03) || (uVar11 == 0x5a5a5a5a)) {
        this->m_hdType = DTS_SUBTYPE_EX;
      }
      else if (uVar11 == 0x655e315e) {
        this->m_hdType = DTS_SUBTYPE_HIGH_RES;
      }
      else {
        this->m_hdType = DTS_SUBTYPE_OTHER;
      }
      nuNumAudioPresent._3_1_ = 1;
      bVar3 = BitStreamReader::getBit((BitStreamReader *)local_48);
      if (bVar3) {
        BitStreamReader::skipBits((BitStreamReader *)local_48,2);
        bVar4 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,3);
        if (this->pi_frame_length == 0) {
          this->pi_frame_length = (bVar4 + 1) * 0x200;
        }
        bVar5 = BitStreamReader::getBit((BitStreamReader *)local_48);
        if (bVar5) {
          BitStreamReader::skipBits((BitStreamReader *)local_48,0x12);
          BitStreamReader::skipBits((BitStreamReader *)local_48,0x12);
        }
        bVar4 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,3);
        uVar6 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,3);
        nuNumAudioPresent._3_1_ = uVar6 + 1;
        for (j = 0; j < (int)(bVar4 + 1); j = j + 1) {
          BitStreamReader::skipBits((BitStreamReader *)local_48,bVar1 + 1);
        }
        for (nuBits4MixOutMask = 0; nuBits4MixOutMask < (int)(bVar4 + 1);
            nuBits4MixOutMask = nuBits4MixOutMask + 1) {
          for (nuNumMixOutConfigs = 0; nuNumMixOutConfigs < (int)(bVar1 + 1);
              nuNumMixOutConfigs = nuNumMixOutConfigs + 1) {
            if ((nuNumMixOutConfigs + 1) % 2 != 0) {
              BitStreamReader::skipBits((BitStreamReader *)local_48,8);
            }
          }
        }
        bVar5 = BitStreamReader::getBit((BitStreamReader *)local_48);
        if (bVar5) {
          BitStreamReader::skipBits((BitStreamReader *)local_48,2);
          bVar1 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,2);
          bVar4 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,2);
          for (i_4 = 0; i_4 < (int)(bVar4 + 1); i_4 = i_4 + 1) {
            BitStreamReader::skipBits((BitStreamReader *)local_48,(uint)bVar1 * 4 + 4);
          }
        }
      }
      for (nuInfoTextByteSize = 0; nuInfoTextByteSize < (int)(uint)nuNumAudioPresent._3_1_;
          nuInfoTextByteSize = nuInfoTextByteSize + 1) {
        BitStreamReader::skipBits((BitStreamReader *)local_48,(uint)bVar2 * 4 + 0x10);
      }
      if ((nuNumAudioPresent._3_1_ != 0) &&
         (BitStreamReader::skipBits((BitStreamReader *)local_48,0xc), bVar3)) {
        bVar2 = BitStreamReader::getBit((BitStreamReader *)local_48);
        if (bVar2) {
          BitStreamReader::skipBits((BitStreamReader *)local_48,4);
        }
        bVar2 = BitStreamReader::getBit((BitStreamReader *)local_48);
        if (bVar2) {
          BitStreamReader::skipBits((BitStreamReader *)local_48,0x18);
        }
        bVar2 = BitStreamReader::getBit((BitStreamReader *)local_48);
        if (bVar2) {
          uVar8 = BitStreamReader::getBits<unsigned_short>((BitStreamReader *)local_48,10);
          for (_nuSpkrActivityMask = 0; _nuSpkrActivityMask < (int)(uVar8 + 1);
              _nuSpkrActivityMask = _nuSpkrActivityMask + 1) {
            BitStreamReader::skipBits((BitStreamReader *)local_48,8);
          }
        }
        bVar1 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,5);
        bVar4 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,4);
        uVar6 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,8);
        this->hd_pi_channels = uVar6 + '\x01';
        e._4_2_ = 0;
        bVar2 = BitStreamReader::getBit((BitStreamReader *)local_48);
        if (bVar2) {
          if (2 < this->hd_pi_channels) {
            BitStreamReader::skipBit((BitStreamReader *)local_48);
          }
          if (6 < this->hd_pi_channels) {
            BitStreamReader::skipBit((BitStreamReader *)local_48);
          }
          bVar2 = BitStreamReader::getBit((BitStreamReader *)local_48);
          if (bVar2) {
            bVar7 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,2);
            e._4_2_ = BitStreamReader::getBits<unsigned_short>
                                ((BitStreamReader *)local_48,(uint)bVar7 * 4 + 4);
          }
        }
        this->hd_pi_sample_rate = dtshd_samplerate[bVar4];
        this->hd_bitDepth = bVar1 + 1;
        if ((this->m_isCoreExists & 1U) == 0) {
          this->m_frameDuration =
               ((double)this->pi_frame_length * 5292000000.0) / (double)this->hd_pi_sample_rate;
        }
        if (this->m_hdType != DTS_SUBTYPE_MASTER_AUDIO) {
          lVar12 = lround(((double)this->hd_pi_sample_rate / (double)this->pi_frame_length) *
                          (double)hdAudioData._4_4_ * 8.0);
          this->m_hdBitrate = (int)lVar12;
        }
        this->hd_pi_lfeCnt = 0;
        if ((e._4_2_ & 8) == 8) {
          this->hd_pi_lfeCnt = this->hd_pi_lfeCnt + 1;
        }
        if ((e._4_2_ & 0x1000) == 0x1000) {
          this->hd_pi_lfeCnt = this->hd_pi_lfeCnt + 1;
        }
      }
      this_local._4_4_ = hdAudioData._4_4_;
    }
  }
  else {
    this_local._4_4_ = hdAudioData._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int DTSStreamReader::decodeHdInfo(uint8_t* buff, const uint8_t* end)
{
    try
    {
        BitStreamReader reader{};
        reader.setBuffer(buff + 5, end);  // skip 4 byte magic and 1 unknown byte
        int headerSize;
        int hdFrameSize;
        const auto nuSubStreamIndex = reader.getBits<uint8_t>(2);
        const bool isBlownUpHeader = reader.getBit();
        if (isBlownUpHeader)
        {
            headerSize = reader.getBits<uint16_t>(12) + 1;
            hdFrameSize = reader.getBits<int32_t>(20) + 1;
        }
        else
        {
            headerSize = reader.getBits<uint8_t>(8) + 1;
            hdFrameSize = reader.getBits<uint16_t>(16) + 1;
        }
        if (m_hdType == DTSHD_SUBTYPE::DTS_SUBTYPE_UNINITIALIZED)
        {
            if (buff + headerSize + 4 > end)
                return NOT_ENOUGH_BUFFER;
            const auto hdAudioData = reinterpret_cast<uint32_t*>(buff + headerSize);
            switch (my_ntohl(*hdAudioData))
            {
            case 0x41A29547:  // XLL
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_MASTER_AUDIO;
                break;
            case 0x655E315E:  // XBR
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_HIGH_RES;
                break;
            case 0x0A801921:  // LBR
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_EXPRESS;
                break;
            case 0x47004A03:  // XXCH
            case 0x5A5A5A5A:  // XCH
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_EX;
                break;
            case 0x1D95F262:  // X96
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_96;
                break;
            default:  // Core, Substream, Neo, Sensation...
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_OTHER;
            }
        }
        else
            return hdFrameSize;

        uint8_t nuNumAssets = 1;
        const bool bStaticFieldsPresent = reader.getBit();
        if (bStaticFieldsPresent)
        {
            reader.skipBits(2);  // nuRefClockCode
            const auto nuExSSFrameDurationCode = reader.getBits<uint8_t>(3) + 1;
            if (pi_frame_length == 0)
                pi_frame_length = nuExSSFrameDurationCode << 9;

            if (reader.getBit())
            {
                reader.skipBits(18);  // nuTimeStamp, 18 high bits
                reader.skipBits(18);  // nuTimeStamp, 18 low bits
            }
            const auto nuNumAudioPresent = reader.getBits<uint8_t>(3) + 1;
            nuNumAssets = reader.getBits<uint8_t>(3) + 1;
            for (int i = 0; i < nuNumAudioPresent; i++) reader.skipBits(nuSubStreamIndex + 1);
            for (int i = 0; i < nuNumAudioPresent; i++)
            {
                for (int j = 0; j < nuSubStreamIndex + 1; j++)
                {
                    if ((j + 1) % 2)
                        reader.skipBits(8);
                }
            }
            if (reader.getBit())
            {
                reader.skipBits(2);  // nuMixMetadataAdjLevel
                const auto nuBits4MixOutMask = reader.getBits<uint8_t>(2) * 4 + 4;
                const auto nuNumMixOutConfigs = reader.getBits<uint8_t>(2) + 1;
                for (int i = 0; i < nuNumMixOutConfigs; i++) reader.skipBits(nuBits4MixOutMask);
            }
        }
        for (int i = 0; i < nuNumAssets; i++) reader.skipBits(isBlownUpHeader ? 20 : 16);

        // JCDR TODO: have a look at this loop: with the 'break', i is never incremented
        for (int i = 0; i < nuNumAssets; i++)
        {
            reader.skipBits(12);  // nuAssetDescriptorFSIZE - 1, DescriptorDataForAssetIndex
            if (bStaticFieldsPresent)
            {
                if (reader.getBit())     // AssetTypeDescrPresent
                    reader.skipBits(4);  // AssetTypeDescriptor

                if (reader.getBit())      // LanguageDescrPresent
                    reader.skipBits(24);  // LanguageDescriptor

                if (reader.getBit())  // bInfoTextPresent
                {
                    const auto nuInfoTextByteSize = reader.getBits<uint16_t>(10) + 1;
                    for (int j = 0; j < nuInfoTextByteSize; j++) reader.skipBits(8);
                }
                const auto nuBitResolution = reader.getBits<uint8_t>(5) + 1;
                const auto nuMaxSampleRate = reader.getBits<uint8_t>(4);
                hd_pi_channels = reader.getBits<uint8_t>(8) + 1;
                uint16_t nuSpkrActivityMask = 0;
                if (reader.getBit())  // bOne2OneMapChannels2Speakers
                {
                    if (hd_pi_channels > 2)
                        reader.skipBit();  // bEmbeddedStereoFlag

                    if (hd_pi_channels > 6)
                        reader.skipBit();  // bEmbeddedSixChFlag

                    if (reader.getBit())  // bSpkrMaskEnabled
                    {
                        const auto nuNumBits4SAMask = reader.getBits<uint8_t>(2) * 4 + 4;
                        nuSpkrActivityMask = reader.getBits<uint16_t>(nuNumBits4SAMask);
                    }
                    // TODO...
                }
                hd_pi_sample_rate = dtshd_samplerate[nuMaxSampleRate];
                hd_bitDepth = nuBitResolution;

                if (!m_isCoreExists)
                    m_frameDuration = static_cast<double>(pi_frame_length) * INTERNAL_PTS_FREQ / hd_pi_sample_rate;

                if (m_hdType != DTSHD_SUBTYPE::DTS_SUBTYPE_MASTER_AUDIO)
                    m_hdBitrate = lround(static_cast<double>(hd_pi_sample_rate) / pi_frame_length * hdFrameSize * 8);

                hd_pi_lfeCnt = 0;

                if ((nuSpkrActivityMask & 0x8) == 0x8)
                    ++hd_pi_lfeCnt;

                if ((nuSpkrActivityMask & 0x1000) == 0x1000)
                    ++hd_pi_lfeCnt;
            }
            break;
        }
        return hdFrameSize;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}